

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  undefined8 *puVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  void *pvVar4;
  ImDrawChannel *pIVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  
  if ((this->_Current != 0) || (1 < this->_Count)) {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0x5d5,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar2 = (this->_Channels).Size;
  if (iVar2 < channels_count) {
    if ((this->_Channels).Capacity < channels_count) {
      pIVar5 = (ImDrawChannel *)ImGui::MemAlloc((long)channels_count << 5);
      pIVar3 = (this->_Channels).Data;
      if (pIVar3 != (ImDrawChannel *)0x0) {
        memcpy(pIVar5,pIVar3,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = pIVar5;
      (this->_Channels).Capacity = channels_count;
    }
    iVar11 = (this->_Channels).Capacity;
    if (iVar11 < channels_count) {
      if (iVar11 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar11 / 2 + iVar11;
      }
      if (iVar9 <= channels_count) {
        iVar9 = channels_count;
      }
      if (iVar11 < iVar9) {
        pIVar5 = (ImDrawChannel *)ImGui::MemAlloc((long)iVar9 << 5);
        pIVar3 = (this->_Channels).Data;
        if (pIVar3 != (ImDrawChannel *)0x0) {
          memcpy(pIVar5,pIVar3,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = pIVar5;
        (this->_Channels).Capacity = iVar9;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  if (0 < (this->_Channels).Size) {
    pIVar3 = (this->_Channels).Data;
    (pIVar3->_IdxBuffer).Size = 0;
    (pIVar3->_IdxBuffer).Capacity = 0;
    (pIVar3->_IdxBuffer).Data = (unsigned_short *)0x0;
    (pIVar3->_CmdBuffer).Size = 0;
    (pIVar3->_CmdBuffer).Capacity = 0;
    (pIVar3->_CmdBuffer).Data = (ImDrawCmd *)0x0;
    if (1 < channels_count) {
      uVar12 = 1;
      lVar8 = 0x38;
      do {
        lVar6 = (long)(this->_Channels).Size;
        if ((long)uVar12 < (long)iVar2) {
          if (lVar6 <= (long)uVar12) goto LAB_0014edef;
          pIVar3 = (this->_Channels).Data;
          iVar11 = *(int *)((long)pIVar3 + lVar8 + -0x14);
          if (iVar11 < 0) {
            uVar10 = iVar11 / 2 + iVar11;
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            pvVar7 = ImGui::MemAlloc((ulong)uVar10 * 0x38);
            pvVar4 = *(void **)((long)pIVar3 + lVar8 + -0x10);
            if (pvVar4 != (void *)0x0) {
              memcpy(pvVar7,pvVar4,(long)*(int *)((long)pIVar3 + lVar8 + -0x18) * 0x38);
              ImGui::MemFree(*(void **)((long)pIVar3 + lVar8 + -0x10));
            }
            *(void **)((long)pIVar3 + lVar8 + -0x10) = pvVar7;
            *(uint *)((long)pIVar3 + lVar8 + -0x14) = uVar10;
          }
          *(undefined4 *)((long)pIVar3 + lVar8 + -0x18) = 0;
          if ((long)(this->_Channels).Size <= (long)uVar12) goto LAB_0014edef;
          pIVar3 = (this->_Channels).Data;
          iVar11 = *(int *)((long)pIVar3 + lVar8 + -4);
          if (iVar11 < 0) {
            iVar11 = iVar11 / 2 + iVar11;
            if (iVar11 < 1) {
              iVar11 = 0;
            }
            pvVar7 = ImGui::MemAlloc((ulong)(uint)(iVar11 * 2));
            pvVar4 = *(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar8);
            if (pvVar4 != (void *)0x0) {
              memcpy(pvVar7,pvVar4,(long)*(int *)((long)pIVar3 + lVar8 + -8) * 2);
              ImGui::MemFree(*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar8));
            }
            *(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar8) = pvVar7;
            *(int *)((long)pIVar3 + lVar8 + -4) = iVar11;
          }
          *(undefined4 *)((long)pIVar3 + lVar8 + -8) = 0;
        }
        else {
          if (lVar6 <= (long)uVar12) goto LAB_0014edef;
          pIVar3 = (this->_Channels).Data;
          puVar1 = (undefined8 *)((long)pIVar3 + lVar8 + -8);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pIVar3 + lVar8 + -0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
        uVar12 = uVar12 + 1;
        lVar8 = lVar8 + 0x20;
      } while ((uint)channels_count != uVar12);
    }
    return;
  }
LAB_0014edef:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.h"
                ,0x65c,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}